

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  ostringstream *poVar4;
  Precision PVar5;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar6;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  Variable<tcu::Vector<float,_4>_> *pVVar9;
  pointer pcVar10;
  TestStatus *pTVar11;
  pointer pVVar12;
  bool bVar13;
  int iVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  IVal *pIVar18;
  undefined8 *puVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  FloatFormat *pFVar21;
  string *psVar22;
  char *pcVar23;
  _Base_ptr p_Var24;
  ulong size;
  byte bVar25;
  IVal reference1;
  FuncSet funcs;
  IVal reference0;
  IVal in3;
  IVal in0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_> outputs;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  inputs;
  void *outputArr [2];
  Environment env;
  void *inputArr [4];
  FloatFormat highpFmt;
  ostringstream oss;
  ResultCollector status;
  undefined1 auStack_5b8 [7];
  IVal local_5b1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5b0;
  undefined1 local_5a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  _Rb_tree_node_base *local_588;
  double local_580;
  undefined1 auStack_558 [8];
  _Alloc_hider _Stack_550;
  undefined1 local_548 [104];
  ulong local_4e0;
  FloatFormat *local_4d8;
  string local_4d0;
  TestStatus *local_4b0;
  long local_4a8;
  long local_4a0;
  undefined1 local_498 [32];
  double local_478;
  Precision local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_468;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  local_318;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  pointer local_288;
  pointer local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_278;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  pointer local_230;
  FloatFormat local_228;
  undefined8 uStack_200;
  IVal local_1f8;
  ios_base local_188 [264];
  ResultCollector local_80;
  
  bVar25 = 0;
  this_00 = this->m_samplings;
  pFVar21 = &(this->m_caseCtx).floatFormat;
  PVar5 = (this->m_caseCtx).precision;
  sVar6 = (this->m_caseCtx).numRandoms;
  local_4b0 = __return_storage_ptr__;
  iVar14 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4d8 = pFVar21;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,vkt::shaderexecutor::Void>>
            (&local_2e8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
              *)pFVar21,(FloatFormat *)(ulong)PVar5,(Precision)sVar6,(ulong)(iVar14 + 0xdeadbeef),
             (deUint32)this);
  pVVar12 = local_2e8.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  size = (long)local_2e8.in0.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_2e8.in0.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_318,size);
  local_228.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_228.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_228.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_228.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_228.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_228.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_228.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_228.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_228._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_278._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_278._M_impl.super__Rb_tree_header._M_header;
  local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_278._M_impl.super__Rb_tree_header._M_header._M_right =
       local_278._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_5b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_248 = local_2e8.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_240 = local_2e8.in1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_238 = local_2e8.in2.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_230 = local_2e8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_318.out0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_280 = local_318.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_498 + 8);
  local_498._0_8_ = local_5b0;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  p_Var3 = (_Rb_tree_node_base *)(local_5a8 + 8);
  local_5a8._8_4_ = _S_red;
  local_598._M_allocated_capacity = 0;
  local_580 = 0.0;
  pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_598._8_8_ = p_Var3;
  local_588 = p_Var3;
  (*pSVar7->_vptr_Statement[4])(pSVar7,local_5a8);
  if ((_Rb_tree_node_base *)local_598._8_8_ != p_Var3) {
    uVar15 = local_598._8_8_;
    do {
      (**(code **)(**(long **)(uVar15 + 0x20) + 0x30))(*(long **)(uVar15 + 0x20),&local_1f8);
      uVar15 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar15);
    } while ((_Rb_tree_node_base *)uVar15 != p_Var3);
  }
  if (local_580 != 0.0) {
    poVar4 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_5b0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(char *)local_548._0_8_,local_548._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
      operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_5a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  pSVar8 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  local_4e0 = size;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,size & 0xffffffff,&local_248,&local_288,0);
  pFVar21 = local_4d8;
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&local_4a8 + lVar16) = 0;
    *(undefined8 *)((long)&local_4a0 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_498 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x70);
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&local_4a8 + lVar16) = 0;
    *(undefined8 *)((long)&local_4a0 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_498 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x70);
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&local_228.m_maxValue + lVar16) = 0;
    *(undefined8 *)((long)&uStack_200 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x70);
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&local_228.m_maxValue + lVar16) = 0;
    *(undefined8 *)((long)&uStack_200 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x70);
  lVar16 = 0x10;
  do {
    auStack_5b8[lVar16] = 0;
    *(undefined8 *)((long)&local_5b0 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_5a8 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x70);
  lVar16 = 0x10;
  do {
    auStack_5b8[lVar16] = 0;
    *(undefined8 *)((long)&local_5b0 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_5a8 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x70);
  lVar16 = 0x10;
  do {
    auStack_558[lVar16] = 0;
    *(undefined8 *)((long)&_Stack_550._M_p + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_548 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x70);
  lVar16 = 0x10;
  do {
    auStack_558[lVar16] = 0;
    *(undefined8 *)((long)&_Stack_550._M_p + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_548 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x70);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_278,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_498);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_278,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             &local_1f8);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_278,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_5a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_278,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d0);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_278,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_548);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_278,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_5b1);
  if (local_2e8.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar12) {
    iVar14 = 0;
  }
  else {
    local_4a8 = local_4e0 + (local_4e0 == 0);
    lVar16 = 0;
    iVar14 = 0;
    do {
      lVar17 = 0x10;
      do {
        *(undefined1 *)((long)&local_228.m_maxValue + lVar17) = 0;
        *(undefined8 *)((long)&uStack_200 + lVar17) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x70);
      lVar17 = 0x10;
      do {
        *(undefined1 *)((long)&local_228.m_maxValue + lVar17) = 0;
        *(undefined8 *)((long)&uStack_200 + lVar17) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x70);
      local_548._0_8_ =
           *(undefined8 *)
            local_2e8.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar16].m_data;
      local_548._8_8_ =
           *(undefined8 *)
            (local_2e8.in0.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar16].m_data + 2);
      local_4a0 = lVar16;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_5a8,pFVar21,(Vector<float,_4> *)local_548);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,pFVar21,(IVal *)local_5a8);
      pIVar18 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_278,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar19 = (undefined8 *)local_498;
      for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(undefined8 *)pIVar18->m_data = *puVar19;
        puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      local_548._0_8_ =
           *(undefined8 *)
            local_2e8.in1.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar16].m_data;
      local_548._8_8_ =
           *(undefined8 *)
            (local_2e8.in1.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar16].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_5a8,pFVar21,(Vector<float,_4> *)local_548);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,pFVar21,(IVal *)local_5a8);
      pIVar18 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_278,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar19 = (undefined8 *)local_498;
      for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(undefined8 *)pIVar18->m_data = *puVar19;
        puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      local_548._0_8_ =
           *(undefined8 *)
            local_2e8.in2.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar16].m_data;
      local_548._8_8_ =
           *(undefined8 *)
            (local_2e8.in2.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar16].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_5a8,pFVar21,(Vector<float,_4> *)local_548);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,pFVar21,(IVal *)local_5a8);
      pIVar18 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_278,
                           (this->m_variables).in2.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      psVar22 = (string *)local_498;
      for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(pointer *)pIVar18->m_data = (psVar22->_M_dataplus)._M_p;
        psVar22 = (string *)((long)psVar22 + (ulong)bVar25 * -0x10 + 8);
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_278,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_470 = (this->m_caseCtx).precision;
      local_478 = pFVar21->m_maxValue;
      local_498._0_8_ = *(undefined8 *)pFVar21;
      local_498._8_4_ = pFVar21->m_fractionBits;
      local_498._12_4_ = pFVar21->m_hasSubnormal;
      local_498._16_4_ = pFVar21->m_hasInf;
      local_498._20_4_ = pFVar21->m_hasNaN;
      local_498[0x18] = pFVar21->m_exactPrecision;
      local_498._25_3_ = *(undefined3 *)&pFVar21->field_0x19;
      local_498._28_4_ = *(undefined4 *)&pFVar21->field_0x1c;
      local_460 = 0;
      pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_468 = &local_278;
      (*pSVar7->_vptr_Statement[3])(pSVar7,(string *)local_498);
      pIVar18 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_278,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,&local_228,pIVar18);
      psVar22 = (string *)local_498;
      pIVar18 = &local_1f8;
      for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(pointer *)pIVar18->m_data = (psVar22->_M_dataplus)._M_p;
        psVar22 = (string *)((long)psVar22 + (ulong)bVar25 * -0x10 + 8);
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      bVar13 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         (&local_1f8,
                          local_318.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar16);
      local_498._0_8_ = local_498 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(&local_80,bVar13,(string *)local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_498 + 0x10)) {
        operator_delete((void *)local_498._0_8_,CONCAT44(local_498._20_4_,local_498._16_4_) + 1);
      }
      iVar14 = iVar14 + ((byte)~bVar13 & 1);
      if (iVar14 < 0x65 && !bVar13) {
        local_498._0_8_ = local_5b0;
        poVar4 = (ostringstream *)(local_498 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar4);
        pcVar23 = "Failed";
        if (bVar13) {
          pcVar23 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,pcVar23,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar9 = (this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        paVar20 = &local_598;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_5a8._0_8_ = paVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5a8,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_5a8._0_8_,
                   CONCAT44(local_5a8._12_4_,local_5a8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_548,(shaderexecutor *)&local_228,
                   (FloatFormat *)
                   (local_2e8.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar16),(Vector<float,_4> *)paVar20)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_548._0_8_,local_548._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
          operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._0_8_ != &local_598) {
          operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar9 = (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        paVar20 = &local_598;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_5a8._0_8_ = paVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5a8,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_5a8._0_8_,
                   CONCAT44(local_5a8._12_4_,local_5a8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_548,(shaderexecutor *)&local_228,
                   (FloatFormat *)
                   (local_2e8.in1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar16),(Vector<float,_4> *)paVar20)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_548._0_8_,local_548._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
          operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._0_8_ != &local_598) {
          operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar9 = (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        paVar20 = &local_598;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_5a8._0_8_ = paVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5a8,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_5a8._0_8_,
                   CONCAT44(local_5a8._12_4_,local_5a8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_548,(shaderexecutor *)&local_228,
                   (FloatFormat *)
                   (local_2e8.in2.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar16),(Vector<float,_4> *)paVar20)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_548._0_8_,local_548._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
          operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._0_8_ != &local_598) {
          operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar9 = (this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        paVar20 = &local_598;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_5a8._0_8_ = paVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5a8,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_5a8._0_8_,
                   CONCAT44(local_5a8._12_4_,local_5a8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_548,(shaderexecutor *)&local_228,
                   (FloatFormat *)
                   (local_318.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar16),(Vector<float,_4> *)paVar20)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_548._0_8_,local_548._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_4d0,(shaderexecutor *)&local_228,(FloatFormat *)&local_1f8,(IVal *)paVar20
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
          operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._0_8_ != &local_598) {
          operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._M_allocated_capacity + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar4);
        std::ios_base::~ios_base(local_420);
      }
      lVar16 = local_4a0 + 1;
      pFVar21 = local_4d8;
    } while (lVar16 != local_4a8);
  }
  pTVar11 = local_4b0;
  if (100 < iVar14) {
    poVar4 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_5b0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
    std::ostream::operator<<(poVar4,iVar14 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_420);
  }
  if (iVar14 == 0) {
    poVar4 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_5b0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    poVar4 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_5b0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_498 + 8));
  std::ios_base::~ios_base(local_420);
  if (iVar14 == 0) {
    local_498._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_498 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"Pass","");
    pTVar11->m_code = QP_TEST_RESULT_PASS;
    (pTVar11->m_description)._M_dataplus._M_p = (pointer)&(pTVar11->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar11->m_description,local_498._0_8_,
               (char *)(local_498._0_8_ + CONCAT44(local_498._12_4_,local_498._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_498 + 0x10)) goto LAB_008e4ee2;
    uVar15 = (_Base_ptr)CONCAT44(local_498._20_4_,local_498._16_4_);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    std::ostream::operator<<(local_498,iVar14);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_498 + 0x10);
    local_498._0_8_ = paVar20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498," test failed. Check log for the details","");
    p_Var2 = (_Base_ptr)
             (CONCAT44(local_498._12_4_,local_498._8_4_) +
             CONCAT44(local_5a8._12_4_,local_5a8._8_4_));
    uVar15 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._0_8_ != &local_598) {
      uVar15 = local_598._M_allocated_capacity;
    }
    if ((ulong)uVar15 < p_Var2) {
      p_Var24 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ != paVar20) {
        p_Var24 = (_Base_ptr)CONCAT44(local_498._20_4_,local_498._16_4_);
      }
      if (p_Var24 < p_Var2) goto LAB_008e4d77;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_498,0,(char *)0x0,local_5a8._0_8_);
    }
    else {
LAB_008e4d77:
      puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_5a8,local_498._0_8_);
    }
    local_1f8.m_data[0]._0_8_ = &local_1f8.m_data[0].m_hi;
    pdVar1 = (double *)(puVar19 + 2);
    if ((double *)*puVar19 == pdVar1) {
      local_1f8.m_data[0].m_hi = *pdVar1;
      local_1f8.m_data[1]._0_4_ = *(undefined4 *)(puVar19 + 3);
      local_1f8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar19 + 0x1c);
    }
    else {
      local_1f8.m_data[0].m_hi = *pdVar1;
      local_1f8.m_data[0]._0_8_ = (double *)*puVar19;
    }
    local_1f8.m_data[0].m_lo = (double)puVar19[1];
    *puVar19 = pdVar1;
    puVar19[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar11->m_code = QP_TEST_RESULT_FAIL;
    (pTVar11->m_description)._M_dataplus._M_p = (pointer)&(pTVar11->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar11->m_description,local_1f8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1f8.m_data[0].m_lo + local_1f8.m_data[0]._0_8_));
    if ((double *)local_1f8.m_data[0]._0_8_ != &local_1f8.m_data[0].m_hi) {
      operator_delete((void *)local_1f8.m_data[0]._0_8_,(long)local_1f8.m_data[0].m_hi + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != paVar20) {
      operator_delete((void *)local_498._0_8_,CONCAT44(local_498._20_4_,local_498._16_4_) + 1);
    }
    uVar15 = local_598._M_allocated_capacity;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._0_8_ == &local_598) goto LAB_008e4ee2;
  }
  operator_delete(paVar20,(ulong)((long)&((_Base_ptr)uVar15)->_M_color + 1));
LAB_008e4ee2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_278);
  if (local_318.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_318.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.in2.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.in2.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.in2.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.in2.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.in1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.in1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar11;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}